

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdlib.cpp
# Opt level: O2

char * myasctime(void)

{
  tm *__tp;
  char *pcVar1;
  time_t clock;
  time_t local_10;
  
  time(&local_10);
  __tp = localtime(&local_10);
  if (__tp == (tm *)0x0) {
    pcVar1 = "Pre Jan 01 00:00:00 1970\n";
  }
  else {
    pcVar1 = asctime(__tp);
  }
  return pcVar1;
}

Assistant:

const char *myasctime ()
{
	time_t clock;
	struct tm *lt;

	time (&clock);
	lt = localtime (&clock);
	if (lt != NULL)
	{
		return asctime (lt);
	}
	else
	{
		return "Pre Jan 01 00:00:00 1970\n";
	}
}